

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

Result __thiscall
httplib::ClientImpl::Get(ClientImpl *this,char *path,Headers *headers,Progress *progress)

{
  undefined8 uVar1;
  size_t sVar2;
  ssize_t sVar3;
  undefined8 extraout_RDX;
  int __flags;
  function<bool_(unsigned_long,_unsigned_long)> *in_R8;
  Result RVar4;
  type res;
  Error error;
  Request req;
  _Head_base<0UL,_httplib::Response_*,_false> local_280;
  undefined4 local_274;
  _Head_base<0UL,_httplib::Response_*,_false> local_270;
  function<bool_(unsigned_long,_unsigned_long)> *local_268;
  undefined1 local_260 [72];
  _Rb_tree_node_base local_218;
  size_t local_1f8;
  _Alloc_hider local_1f0;
  size_type local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  _Alloc_hider local_1d0;
  size_type local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  int local_1b0;
  _Alloc_hider local_1a8;
  size_type local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  _Alloc_hider local_188;
  size_type local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  _Rb_tree_node_base local_160;
  size_t local_140;
  _Rb_tree_node_base local_130;
  size_t local_110;
  pointer ppStack_108;
  pointer local_100;
  pointer ppStack_f8;
  pointer local_f0;
  pointer psStack_e8;
  pointer local_e0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_d8;
  size_t local_d0;
  _Any_data local_c8;
  _Manager_type local_b8;
  _Invoker_type p_Stack_b0;
  _Any_data local_a8;
  _Manager_type local_98;
  _Invoker_type p_Stack_90;
  size_t local_88;
  _Any_data _Stack_80;
  undefined1 uStack_70;
  undefined7 local_6f;
  undefined1 uStack_68;
  undefined8 uStack_67;
  _Any_data local_58;
  _Manager_type local_48;
  _Invoker_type p_Stack_40;
  size_t local_38;
  
  local_260._0_8_ = local_260 + 0x10;
  local_260._8_8_ = 0;
  local_260[0x10] = '\0';
  local_260._32_8_ = local_260 + 0x30;
  local_260._40_8_ = (char *)0x0;
  local_260[0x30] = '\0';
  local_218._M_left = &local_218;
  local_218._M_color = _S_red;
  local_218._M_parent = (_Base_ptr)0x0;
  local_1f8 = 0;
  local_1f0._M_p = (pointer)&local_1e0;
  local_1e8 = 0;
  local_1e0._M_local_buf[0] = '\0';
  local_1d0._M_p = (pointer)&local_1c0;
  local_1c8 = 0;
  local_1c0._M_local_buf[0] = '\0';
  local_1b0 = -1;
  local_1a8._M_p = (pointer)&local_198;
  local_1a0 = 0;
  local_198._M_local_buf[0] = '\0';
  local_188._M_p = (pointer)&local_178;
  local_180 = 0;
  local_178._M_local_buf[0] = '\0';
  local_160._M_left = &local_160;
  local_160._M_color = _S_red;
  local_160._M_parent = (_Base_ptr)0x0;
  local_140 = 0;
  local_130._M_left = &local_130;
  local_130._M_color = _S_red;
  local_130._M_parent = (_Base_ptr)0x0;
  local_e0 = (pointer)0x0;
  _Stack_d8._M_current = (char *)0x0;
  local_f0 = (pointer)0x0;
  psStack_e8 = (pointer)0x0;
  local_100 = (pointer)0x0;
  ppStack_f8 = (pointer)0x0;
  local_110 = 0;
  ppStack_108 = (pointer)0x0;
  local_d0 = 0x14;
  uStack_68 = 0;
  uStack_67 = 0;
  _Stack_80._8_8_ = 0;
  uStack_70 = 0;
  local_6f = 0;
  local_88 = 0;
  _Stack_80._M_unused._M_object = (void *)0x0;
  local_98 = (_Manager_type)0x0;
  p_Stack_90 = (_Invoker_type)0x0;
  local_a8._M_unused._M_object = (void *)0x0;
  local_a8._8_8_ = 0;
  local_b8 = (_Manager_type)0x0;
  p_Stack_b0 = (_Invoker_type)0x0;
  local_c8._M_unused._M_object = (void *)0x0;
  local_c8._8_8_ = 0;
  local_38 = 0;
  local_48 = (_Manager_type)0x0;
  p_Stack_40 = (_Invoker_type)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_268 = in_R8;
  local_218._M_right = local_218._M_left;
  local_160._M_right = local_160._M_left;
  local_130._M_right = local_130._M_left;
  std::__cxx11::string::_M_replace((ulong)local_260,0,(char *)0x0,0x12fd4d);
  uVar1 = local_260._40_8_;
  sVar2 = strlen((char *)headers);
  __flags = (int)sVar2;
  std::__cxx11::string::_M_replace((ulong)(local_260 + 0x20),0,(char *)uVar1,(ulong)headers);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_260 + 0x40),
              (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(path + 0xc0));
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::
  _M_insert_range_equal<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)(local_260 + 0x40),(_Base_ptr)progress->_M_invoker,
             (_Base_ptr)((long)&(progress->super__Function_base)._M_functor + 8));
  std::function<bool_(unsigned_long,_unsigned_long)>::operator=
            ((function<bool_(unsigned_long,_unsigned_long)> *)&local_58,local_268);
  detail::make_unique<httplib::Response>();
  local_274 = 0;
  sVar3 = send((ClientImpl *)path,(int)local_260,local_280._M_head_impl,(size_t)&local_274,__flags);
  if ((char)sVar3 == '\0') {
    local_270._M_head_impl = (Response *)0x0;
  }
  else {
    local_270._M_head_impl = local_280._M_head_impl;
    local_280._M_head_impl = (Response *)0x0;
  }
  this->_vptr_ClientImpl = (_func_int **)local_270._M_head_impl;
  local_270._M_head_impl = (Response *)0x0;
  *(undefined4 *)&(this->host_)._M_dataplus._M_p = local_274;
  std::unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_>::~unique_ptr
            ((unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_> *)&local_270);
  std::unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_>::~unique_ptr
            ((unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_> *)&local_280);
  Request::~Request((Request *)local_260);
  RVar4._8_8_ = extraout_RDX;
  RVar4.res_._M_t.super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>.
  _M_t.super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>.
  super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl =
       (__uniq_ptr_data<httplib::Response,_std::default_delete<httplib::Response>,_true,_true>)
       (__uniq_ptr_data<httplib::Response,_std::default_delete<httplib::Response>,_true,_true>)this;
  return RVar4;
}

Assistant:

inline Result ClientImpl::Get(const char *path, const Headers &headers,
								  Progress progress) {
		Request req;
		req.method = "GET";
		req.path = path;
		req.headers = default_headers_;
		req.headers.insert(headers.begin(), headers.end());
		req.progress_ = std::move(progress);

		return send(req);
	}